

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O1

void __thiscall asl::Thread::~Thread(Thread *this)

{
  this->_vptr_Thread = (_func_int **)&PTR__Thread_001528e8;
  if (this->_thread == 0) {
    return;
  }
  pthread_detach(this->_thread);
  return;
}

Assistant:

virtual ~Thread()
	{
		if (_thread != 0) {
#ifdef _WIN32
			CloseHandle(_thread);
#else
			pthread_detach(_thread);
#endif
		}
	}